

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O2

void __thiscall ElfFile::writeHeader(ElfFile *this,ByteArray *data,size_t pos,Endianness endianness)

{
  byte *pbVar1;
  undefined8 uVar2;
  
  pbVar1 = (this->fileData).data_;
  uVar2 = *(undefined8 *)((this->fileHeader).e_ident + 8);
  *(undefined8 *)pbVar1 = *(undefined8 *)(this->fileHeader).e_ident;
  *(undefined8 *)(pbVar1 + 8) = uVar2;
  ByteArray::replaceWord(data,pos + 0x10,(uint)(this->fileHeader).e_type,endianness);
  ByteArray::replaceWord(data,pos + 0x12,(uint)(this->fileHeader).e_machine,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x14,(this->fileHeader).e_version,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x18,(this->fileHeader).e_entry,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x1c,(this->fileHeader).e_phoff,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x20,(this->fileHeader).e_shoff,endianness);
  ByteArray::replaceDoubleWord(data,pos + 0x24,(this->fileHeader).e_flags,endianness);
  ByteArray::replaceWord(data,pos + 0x28,(uint)(this->fileHeader).e_ehsize,endianness);
  ByteArray::replaceWord(data,pos + 0x2a,(uint)(this->fileHeader).e_phentsize,endianness);
  ByteArray::replaceWord(data,pos + 0x2c,(uint)(this->fileHeader).e_phnum,endianness);
  ByteArray::replaceWord(data,pos + 0x2e,(uint)(this->fileHeader).e_shentsize,endianness);
  ByteArray::replaceWord(data,pos + 0x30,(uint)(this->fileHeader).e_shnum,endianness);
  ByteArray::replaceWord(data,pos + 0x32,(uint)(this->fileHeader).e_shstrndx,endianness);
  return;
}

Assistant:

void ElfFile::writeHeader(ByteArray& data, size_t pos, Endianness endianness)
{
	memcpy(&fileData[0], fileHeader.e_ident, sizeof(fileHeader.e_ident));
	data.replaceWord(pos + 0x10, fileHeader.e_type, endianness);
	data.replaceWord(pos + 0x12, fileHeader.e_machine, endianness);
	data.replaceDoubleWord(pos + 0x14, fileHeader.e_version, endianness);
	data.replaceDoubleWord(pos + 0x18, fileHeader.e_entry, endianness);
	data.replaceDoubleWord(pos + 0x1C, fileHeader.e_phoff, endianness);
	data.replaceDoubleWord(pos + 0x20, fileHeader.e_shoff, endianness);
	data.replaceDoubleWord(pos + 0x24, fileHeader.e_flags, endianness);
	data.replaceWord(pos + 0x28, fileHeader.e_ehsize, endianness);
	data.replaceWord(pos + 0x2A, fileHeader.e_phentsize, endianness);
	data.replaceWord(pos + 0x2C, fileHeader.e_phnum, endianness);
	data.replaceWord(pos + 0x2E, fileHeader.e_shentsize, endianness);
	data.replaceWord(pos + 0x30, fileHeader.e_shnum, endianness);
	data.replaceWord(pos + 0x32, fileHeader.e_shstrndx, endianness);
}